

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_lib_shutdown(void)

{
  int iVar1;
  unqlite *puVar2;
  jx9 *pjVar3;
  bool bVar4;
  unqlite *pDb;
  jx9 *pEngine;
  
  if (sUnqlMPGlobal.nMagic == 0xea1495ba) {
    pDb = sUnqlMPGlobal.pDB;
    if (0 < sUnqlMPGlobal.nDB) {
      do {
        puVar2 = pDb->pNext;
        unqliteDbRelease(pDb);
        iVar1 = sUnqlMPGlobal.nDB + -1;
        bVar4 = 1 < sUnqlMPGlobal.nDB;
        pDb = puVar2;
        sUnqlMPGlobal.nDB = iVar1;
      } while (bVar4);
    }
    SySetRelease(&sUnqlMPGlobal.kv_storage);
    if (sUnqlMPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) {
      SyMemBackendRelease(&sUnqlMPGlobal.sAllocator);
    }
    sUnqlMPGlobal.nMagic = 0x1764;
    if (sJx9MPGlobal.nMagic == 0xea1495ba) {
      pEngine = sJx9MPGlobal.pEngines;
      if (0 < sJx9MPGlobal.nEngine) {
        do {
          pjVar3 = pEngine->pNext;
          EngineRelease(pEngine);
          iVar1 = sJx9MPGlobal.nEngine + -1;
          bVar4 = 1 < sJx9MPGlobal.nEngine;
          pEngine = pjVar3;
          sJx9MPGlobal.nEngine = iVar1;
        } while (bVar4);
      }
      if (sJx9MPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) {
        SyMemBackendRelease(&sJx9MPGlobal.sAllocator);
      }
      sJx9MPGlobal.nMagic = 0x1928;
    }
  }
  return 0;
}

Assistant:

int unqlite_lib_shutdown(void)
{
	if( sUnqlMPGlobal.nMagic != UNQLITE_LIB_MAGIC ){
		/* Already shut */
		return UNQLITE_OK;
	}
	unqliteCoreShutdown();
	return UNQLITE_OK;
}